

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcunas.h
# Opt level: O0

void __thiscall CTcUnasOutFile::print(CTcUnasOutFile *this,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  osfildef *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char buf [1024];
  char *str;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined4 local_438;
  undefined4 local_434;
  undefined1 *local_430;
  undefined1 *local_428;
  char local_418 [336];
  __va_list_tag *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  local_428 = local_4e8;
  local_430 = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 0x10;
  str = local_418;
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  t3vsprintf(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd38);
  os_fprintz(in_RDI,str);
  return;
}

Assistant:

void print(const char *fmt, ...)
    {
        char buf[1024];
        va_list va;

        /* format the text */
        va_start(va, fmt);
        t3vsprintf(buf, sizeof(buf), fmt, va);
        va_end(va);

        /* write the formatted text to the file */
        os_fprintz(fp_, buf);
    }